

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitset.hpp
# Opt level: O3

bool __thiscall
boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::all
          (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  bVar3 = true;
  if (this->m_num_bits != 0) {
    puVar1 = (this->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar4 = this->m_num_bits & 0x3f;
    if (uVar4 == 0) {
      if ((long)puVar2 - (long)puVar1 != 0) {
        lVar6 = (long)puVar2 - (long)puVar1 >> 3;
        lVar5 = 0;
        do {
          if (puVar1[lVar5] != 0xffffffffffffffff) goto LAB_00119301;
          lVar5 = lVar5 + 1;
        } while (lVar6 + (ulong)(lVar6 == 0) != lVar5);
      }
    }
    else {
      lVar5 = (long)puVar2 - (long)puVar1 >> 3;
      if (lVar5 != 1) {
        lVar6 = 0;
        do {
          if (puVar1[lVar6] != 0xffffffffffffffff) goto LAB_00119301;
          lVar6 = lVar6 + 1;
        } while (lVar5 + -1 != lVar6);
      }
      if (puVar2 == puVar1) {
        __assert_fail("size() > 0 && num_blocks() > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                      ,0x71c,
                      "const Block &boost::dynamic_bitset<>::m_highest_block() const [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                     );
      }
      if ((-1L << (sbyte)uVar4 ^ puVar2[-1]) != 0xffffffffffffffff) {
LAB_00119301:
        bVar3 = false;
      }
    }
  }
  return bVar3;
}

Assistant:

bool dynamic_bitset<Block, Allocator>::all() const
{
    if (empty()) {
        return true;
    }

    const block_width_type extra_bits = count_extra_bits();
    block_type const all_ones = ~static_cast<Block>(0);

    if (extra_bits == 0) {
        for (size_type i = 0, e = num_blocks(); i < e; ++i) {
            if (m_bits[i] != all_ones) {
                return false;
            }
        }
    } else {
        for (size_type i = 0, e = num_blocks() - 1; i < e; ++i) {
            if (m_bits[i] != all_ones) {
                return false;
            }
        }
        block_type const mask = ~(~static_cast<Block>(0) << extra_bits);
        if (m_highest_block() != mask) {
            return false;
        }
    }
    return true;
}